

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryEmitGeometryShaderTests.cpp
# Opt level: O2

TestCaseGroup * vkt::geometry::createEmitGeometryShaderTests(TestContext *testCtx)

{
  TestContext *pTVar1;
  string *psVar2;
  TestCaseGroup *pTVar3;
  TestNode *node;
  int *piVar4;
  int *value;
  long lVar5;
  string *psVar6;
  allocator<char> local_996;
  allocator<char> local_995;
  allocator<char> local_994;
  allocator<char> local_993;
  allocator<char> local_992;
  allocator<char> local_991;
  allocator<char> local_990;
  allocator<char> local_98f;
  allocator<char> local_98e;
  allocator<char> local_98d;
  allocator<char> local_98c;
  allocator<char> local_98b;
  allocator<char> local_98a;
  allocator<char> local_989;
  allocator<char> local_988;
  allocator<char> local_987;
  allocator<char> local_986;
  allocator<char> local_985;
  allocator<char> local_984;
  allocator<char> local_983;
  allocator<char> local_982;
  allocator<char> local_981;
  allocator<char> local_980;
  allocator<char> local_97f;
  allocator<char> local_97e;
  allocator<char> local_97d;
  allocator<char> local_97c;
  allocator<char> local_97b;
  allocator<char> local_97a;
  allocator<char> local_979;
  allocator<char> local_978;
  allocator<char> local_977;
  allocator<char> local_976;
  allocator<char> local_975;
  allocator<char> local_974;
  allocator<char> local_973;
  allocator<char> local_972;
  allocator<char> local_971;
  long local_970;
  string *local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  long local_920;
  long local_918;
  long local_910;
  long local_908;
  long local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  TestContext *local_8b8;
  int *local_8b0;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> emitGroup;
  string local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  string local_858;
  undefined1 local_838 [32];
  undefined1 local_818 [56];
  string local_7e0 [32];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined4 local_7b0;
  string local_7a8 [32];
  string local_788 [32];
  undefined8 local_768;
  undefined8 uStack_760;
  undefined4 local_758;
  string local_750 [32];
  string local_730 [32];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined4 local_700;
  string local_6f8 [32];
  string local_6d8 [32];
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined4 local_6a8;
  string local_6a0 [32];
  string local_680 [32];
  undefined4 local_660;
  undefined8 local_65c;
  undefined8 uStack_654;
  string local_648 [32];
  string local_628 [32];
  undefined8 local_608;
  undefined8 uStack_600;
  undefined4 local_5f8;
  string local_5f0 [32];
  string local_5d0 [32];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined4 local_5a0;
  string local_598 [32];
  string local_578 [32];
  undefined1 *local_558;
  undefined8 uStack_550;
  undefined4 local_548;
  string local_540 [32];
  string local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined4 local_4f0;
  string local_4e8 [32];
  string local_4c8 [32];
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined4 local_498;
  string local_490 [32];
  string local_470 [32];
  undefined1 *local_450;
  undefined8 uStack_448;
  undefined4 local_440;
  string local_438 [32];
  string local_418 [32];
  undefined1 *local_3f8;
  undefined1 *puStack_3f0;
  undefined4 local_3e8;
  string local_3e0 [32];
  string local_3c0 [32];
  undefined4 local_3a0;
  undefined8 local_39c;
  undefined8 uStack_394;
  string local_388 [32];
  string local_368 [32];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined4 local_338;
  string local_330 [32];
  string local_310 [32];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2e0;
  string local_2d8 [32];
  string local_2b8 [32];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined4 local_288;
  string local_280 [32];
  string local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined4 local_230;
  string local_228 [32];
  string local_208 [32];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined4 local_1d8;
  string local_1d0 [32];
  string local_1b0 [32];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined4 local_180;
  string local_178 [32];
  string local_158 [32];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  string local_120 [32];
  string local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  string local_c8 [32];
  string local_a8 [32];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  string local_70 [32];
  string local_50 [32];
  
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  local_8b8 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"emit","Different emit counts.");
  local_818._0_8_ = 0;
  local_818._8_8_ = 0;
  local_818._16_4_ = 0;
  emitGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_818 + 0x18),"points",(allocator<char> *)&local_878);
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"",(allocator<char> *)&local_940);
  local_7c0 = 0;
  uStack_7b8 = 1;
  local_7b0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_7a8,"points",(allocator<char> *)&local_960);
  std::__cxx11::string::string<std::allocator<char>>(local_788,"",(allocator<char> *)&local_8d8);
  local_768 = 0x100000000;
  uStack_760 = 1;
  local_758 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_750,"points",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>(local_730,"",(allocator<char> *)&local_898);
  local_710 = 0;
  uStack_708 = 2;
  local_700 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_6f8,"points",(allocator<char> *)&local_858);
  std::__cxx11::string::string<std::allocator<char>>(local_6d8,"",(allocator<char> *)local_838);
  local_6b8 = 0x100000000;
  uStack_6b0 = 2;
  local_6a8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"points",&local_971);
  std::__cxx11::string::string<std::allocator<char>>(local_680,"",&local_972);
  local_660 = 2;
  local_65c = 0;
  uStack_654 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_648,"line_strip",&local_973);
  std::__cxx11::string::string<std::allocator<char>>(local_628,"",&local_974);
  local_608 = 2;
  uStack_600 = 1;
  local_5f8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_5f0,"line_strip",&local_975);
  std::__cxx11::string::string<std::allocator<char>>(local_5d0,"",&local_976);
  local_5b0 = 0x100000002;
  uStack_5a8 = 1;
  local_5a0 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_598,"line_strip",&local_977);
  std::__cxx11::string::string<std::allocator<char>>(local_578,"",&local_978);
  local_558 = &DAT_200000002;
  uStack_550 = 1;
  local_548 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_540,"line_strip",&local_979);
  std::__cxx11::string::string<std::allocator<char>>(local_520,"",&local_97a);
  local_500 = 2;
  uStack_4f8 = 2;
  local_4f0 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_4e8,"line_strip",&local_97b);
  std::__cxx11::string::string<std::allocator<char>>(local_4c8,"",&local_97c);
  local_4a8 = 0x100000002;
  uStack_4a0 = 2;
  local_498 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_490,"line_strip",&local_97d);
  std::__cxx11::string::string<std::allocator<char>>(local_470,"",&local_97e);
  local_450 = &DAT_200000002;
  uStack_448 = 2;
  local_440 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_438,"line_strip",&local_97f);
  std::__cxx11::string::string<std::allocator<char>>(local_418,"",&local_980);
  local_3f8 = &DAT_200000002;
  puStack_3f0 = &DAT_200000002;
  local_3e8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"line_strip",&local_981);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"",&local_982);
  local_3a0 = 4;
  local_39c = 0;
  uStack_394 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_388,"triangle_strip",&local_983);
  std::__cxx11::string::string<std::allocator<char>>(local_368,"",&local_984);
  local_348 = 4;
  uStack_340 = 1;
  local_338 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_330,"triangle_strip",&local_985);
  std::__cxx11::string::string<std::allocator<char>>(local_310,"",&local_986);
  local_2f0 = 0x100000004;
  uStack_2e8 = 1;
  local_2e0 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"triangle_strip",&local_987);
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"",&local_988);
  local_298 = 0x200000004;
  uStack_290 = 1;
  local_288 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_280,"triangle_strip",&local_989);
  std::__cxx11::string::string<std::allocator<char>>(local_260,"",&local_98a);
  local_240 = 0x300000004;
  uStack_238 = 1;
  local_230 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_228,"triangle_strip",&local_98b);
  std::__cxx11::string::string<std::allocator<char>>(local_208,"",&local_98c);
  local_1e8 = 4;
  uStack_1e0 = 2;
  local_1d8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"triangle_strip",&local_98d);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"",&local_98e);
  local_190 = 0x100000004;
  uStack_188 = 2;
  local_180 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_178,"triangle_strip",&local_98f);
  std::__cxx11::string::string<std::allocator<char>>(local_158,"",&local_990);
  local_138 = 0x200000004;
  uStack_130 = 2;
  local_128 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_120,"triangle_strip",&local_991);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"",&local_992);
  local_e0 = 0x300000004;
  uStack_d8 = 2;
  local_d0 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"triangle_strip",&local_993);
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"",&local_994);
  local_88 = 0x300000004;
  uStack_80 = 0x300000002;
  local_78 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_70,"triangle_strip",&local_995);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_996);
  local_970 = 0xc;
  local_920 = 0x10;
  local_918 = 8;
  local_910 = 4;
  local_908 = 0x18;
  for (lVar5 = 0x38; lVar5 != 0x820; lVar5 = lVar5 + 0x58) {
    psVar6 = (string *)(local_818 + local_908);
    std::__cxx11::string::string((string *)&local_8f8,(string *)psVar6);
    local_900 = lVar5;
    std::operator+(&local_8d8,&local_8f8,"_emit_");
    piVar4 = (int *)(local_818 + local_910);
    de::toString<int>(&local_898,piVar4);
    std::operator+(&local_960,&local_8d8,&local_898);
    local_968 = psVar6;
    std::operator+(&local_940,&local_960,"_end_");
    local_8b0 = (int *)(local_818 + local_918);
    de::toString<int>(&local_858,local_8b0);
    std::operator+(&local_878,&local_940,&local_858);
    psVar6 = local_968;
    std::__cxx11::string::operator=((string *)local_968,(string *)&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_858);
    std::__cxx11::string::~string((string *)&local_940);
    std::__cxx11::string::~string((string *)&local_960);
    std::__cxx11::string::~string((string *)&local_898);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::__cxx11::string::~string((string *)&local_8f8);
    std::__cxx11::string::string((string *)&local_898,(string *)psVar6);
    std::operator+(&local_8f8,&local_898," output, emit ");
    de::toString<int>(&local_858,piVar4);
    std::operator+(&local_8d8,&local_8f8,&local_858);
    std::operator+(&local_960,&local_8d8," vertices, call EndPrimitive ");
    de::toString<int>((string *)local_838,local_8b0);
    std::operator+(&local_940,&local_960,(string *)local_838);
    std::operator+(&local_878,&local_940," times");
    psVar6 = (string *)(local_818 + local_900);
    std::__cxx11::string::operator=((string *)psVar6,(string *)&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_940);
    std::__cxx11::string::~string((string *)local_838);
    std::__cxx11::string::~string((string *)&local_960);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::__cxx11::string::~string((string *)&local_858);
    std::__cxx11::string::~string((string *)&local_8f8);
    std::__cxx11::string::~string((string *)&local_898);
    if (*(int *)(local_818 + local_970) != 0) {
      value = (int *)(local_818 + local_970);
      de::toString<int>(&local_8d8,value);
      std::operator+(&local_960,"_emit_",&local_8d8);
      std::operator+(&local_940,&local_960,"_end_");
      piVar4 = (int *)(local_818 + local_920);
      de::toString<int>(&local_8f8,piVar4);
      std::operator+(&local_878,&local_940,&local_8f8);
      std::__cxx11::string::append((string *)local_968);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::~string((string *)&local_940);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::~string((string *)&local_8d8);
      de::toString<int>(&local_8f8,value);
      std::operator+(&local_8d8,", emit ",&local_8f8);
      std::operator+(&local_960,&local_8d8," vertices, call EndPrimitive ");
      de::toString<int>(&local_898,piVar4);
      std::operator+(&local_940,&local_960,&local_898);
      std::operator+(&local_878,&local_940," times");
      std::__cxx11::string::append((string *)psVar6);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_940);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_8f8);
    }
    pTVar3 = emitGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    node = (TestNode *)operator_new(200);
    lVar5 = local_900;
    psVar2 = local_968;
    TestCase::TestCase((TestCase *)node,local_8b8,local_968,psVar6);
    node->_vptr_TestNode = (_func_int **)&PTR__EmitTest_00c226b0;
    pTVar1 = *(TestContext **)(local_838 + local_970 + 0x1c);
    node[1]._vptr_TestNode = *(_func_int ***)(local_838 + local_970 + 0x14);
    node[1].m_testCtx = pTVar1;
    *(undefined4 *)&node[1].m_name._M_dataplus._M_p = *(undefined4 *)(local_818 + local_970 + 4);
    std::__cxx11::string::string((string *)&node[1].m_name._M_string_length,(string *)psVar2);
    std::__cxx11::string::string((string *)&node[1].m_description._M_string_length,(string *)psVar6)
    ;
    tcu::TestNode::addChild(&pTVar3->super_TestNode,node);
    local_970 = local_970 + 0x58;
    local_920 = local_920 + 0x58;
    local_918 = local_918 + 0x58;
    local_910 = local_910 + 0x58;
    local_908 = local_908 + 0x58;
  }
  lVar5 = 0x790;
  do {
    anon_unknown_0::EmitTestSpec::~EmitTestSpec((EmitTestSpec *)(local_818 + lVar5));
    pTVar3 = emitGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    lVar5 = lVar5 + -0x58;
  } while (lVar5 != -0x58);
  emitGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&emitGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar3;
}

Assistant:

TestCaseGroup* createEmitGeometryShaderTests (TestContext& testCtx)
{
	MovePtr<TestCaseGroup> emitGroup	(new TestCaseGroup(testCtx, "emit", "Different emit counts."));

	// emit different amounts
	{
		EmitTestSpec emitTests[] =
		{
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	0,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	1,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		1,	1,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	2,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		1,	2,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	0,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		1,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		1,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	2,	2,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	0,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	1,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	2,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	1,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	2,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	2,	3,	0,	"triangle_strip",	""},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(emitTests); ++ndx)
		{
			emitTests[ndx].name = std::string(emitTests[ndx].name) + "_emit_" + de::toString(emitTests[ndx].emitCountA) + "_end_" + de::toString(emitTests[ndx].endCountA);
			emitTests[ndx].desc = std::string(emitTests[ndx].name) + " output, emit " + de::toString(emitTests[ndx].emitCountA) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountA) + " times";

			if (emitTests[ndx].emitCountB)
			{
				emitTests[ndx].name += "_emit_" + de::toString(emitTests[ndx].emitCountB) + "_end_" + de::toString(emitTests[ndx].endCountB);
				emitTests[ndx].desc += ", emit " + de::toString(emitTests[ndx].emitCountB) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountB) + " times";
			}

			emitGroup->addChild(new EmitTest(testCtx, emitTests[ndx]));
		}
	}

	return emitGroup.release();
}